

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# piecewise_linear.cpp
# Opt level: O0

double __thiscall
mp::
BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
::maxErrorRelAbove1(BasicPLApproximator<mp::CustomFunctionalConstraint<std::array<int,_1UL>,_std::array<int,_0UL>,_mp::NumericFunctionalConstraintTraits,_mp::CosId>_>
                    *this,double x0,double y0,double x1,double y1)

{
  bool bVar1;
  undefined8 uVar2;
  const_reference pvVar3;
  double *pdVar4;
  long *in_RDI;
  double in_XMM0_Qa;
  double dVar5;
  double in_XMM1_Qa;
  undefined4 in_XMM2_Da;
  undefined4 in_XMM2_Db;
  double in_XMM3_Qa;
  double err;
  value_type_conflict3 y;
  value_type_conflict3 f;
  array<double,_2UL> *pt;
  iterator __end2;
  iterator __begin2;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *__range2;
  double errMax;
  double x_preim_1_1;
  double x_preim_1;
  double xMidDn;
  double slopeTiltedTo;
  double xMidUp;
  double slopeTiltedAway;
  double fp1;
  double fp0;
  double xMid;
  double slope;
  double f1;
  double f0;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> points;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd98;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  *in_stack_fffffffffffffda0;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
  *in_stack_fffffffffffffdb0;
  undefined8 in_stack_fffffffffffffde0;
  int c;
  Error *in_stack_fffffffffffffde8;
  CStringRef in_stack_fffffffffffffdf0;
  CStringRef in_stack_fffffffffffffdf8;
  vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *local_1a8;
  double local_1a0;
  double local_198;
  reference local_190;
  array<double,_2UL> *local_188;
  __normal_iterator<std::array<double,_2UL>_*,_std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
  local_180;
  undefined1 *local_178;
  double local_170 [3];
  BasicCStringRef<char> local_158;
  double local_150;
  undefined8 local_148;
  double local_140;
  BasicCStringRef<char> local_138;
  double local_130;
  undefined8 local_128;
  double local_120;
  Error *local_118;
  double local_110;
  double local_108 [2];
  double local_f8;
  double local_f0;
  double local_e8;
  double local_e0;
  undefined8 local_d8;
  double local_d0;
  double local_c8;
  double local_c0;
  double local_b8;
  double local_b0;
  double local_a8;
  double local_a0;
  double local_98;
  double local_90;
  undefined1 local_88 [24];
  BasicCStringRef<char> local_70;
  undefined1 local_65;
  BasicCStringRef<char> local_58 [6];
  double local_28;
  double local_20;
  double local_18;
  double local_10;
  
  c = (int)((ulong)in_stack_fffffffffffffde0 >> 0x20);
  local_20 = (double)CONCAT44(in_XMM2_Db,in_XMM2_Da);
  if (local_20 <= in_XMM0_Qa) {
    local_65 = 1;
    uVar2 = __cxa_allocate_exception(0x18);
    fmt::BasicCStringRef<char>::BasicCStringRef
              (local_58,"PLApprox maxErrRel(): degenerate segment, x0>=x1: {}, {}");
    fmt::format<double,double>
              (in_stack_fffffffffffffdf8,(double *)in_stack_fffffffffffffdf0.data_,
               (double *)in_stack_fffffffffffffde8);
    fmt::BasicCStringRef<char>::BasicCStringRef
              ((BasicCStringRef<char> *)in_stack_fffffffffffffda0,in_stack_fffffffffffffd98);
    Error::Error(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,c);
    local_65 = 0;
    __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
  }
  if (0.0 < *(double *)(in_RDI[2] + 0x28)) {
    local_28 = in_XMM3_Qa;
    local_18 = in_XMM1_Qa;
    local_10 = in_XMM0_Qa;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::vector
              ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
               0x732688);
    local_90 = (double)(**(code **)(*in_RDI + 0x48))(local_10);
    local_98 = (double)(**(code **)(*in_RDI + 0x48))(local_20);
    local_a8 = local_90;
    local_a0 = local_18;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
              (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    local_b8 = local_98;
    local_b0 = local_28;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
              (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    local_c0 = (local_28 - local_18) / (local_20 - local_10);
    local_c8 = (double)(**(code **)(*in_RDI + 0x100))(local_c0);
    local_d8 = (**(code **)(*in_RDI + 0x48))(local_c8);
    local_d0 = (local_c8 - local_10) * local_c0 + local_18;
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
              (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    local_e0 = (double)(**(code **)(*in_RDI + 0x58))(local_10);
    local_e8 = (double)(**(code **)(*in_RDI + 0x58))(local_20);
    if (local_e8 < local_e0) {
      std::swap<double>(&local_e0,&local_e8);
    }
    local_f0 = local_c0 / (*(double *)(in_RDI[2] + 0x28) + 1.0);
    if ((local_e0 <= local_f0) && (local_f0 <= local_e8)) {
      local_f8 = (double)(**(code **)(*in_RDI + 0x100))(local_f0);
      pdVar4 = local_108;
      dVar5 = (double)(**(code **)(*in_RDI + 0x48))(local_f8);
      in_stack_fffffffffffffdf0.data_ = (char *)pdVar4;
      *pdVar4 = dVar5;
      pdVar4[1] = (local_f8 - local_10) * local_c0 + local_18;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
                (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    }
    if ((((*(double *)(in_RDI[2] + 0x28) != 1.0) || (NAN(*(double *)(in_RDI[2] + 0x28)))) &&
        (local_110 = local_c0 / (1.0 - *(double *)(in_RDI[2] + 0x28)), local_e0 <= local_110)) &&
       (local_110 <= local_e8)) {
      in_stack_fffffffffffffde8 = (Error *)(**(code **)(*in_RDI + 0x100))(local_110);
      local_118 = in_stack_fffffffffffffde8;
      uVar2 = (**(code **)(*in_RDI + 0x48))(in_stack_fffffffffffffde8);
      local_120 = ((double)local_118 - local_10) * local_c0 + local_18;
      local_128 = uVar2;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
                (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
      c = (int)((ulong)uVar2 >> 0x20);
    }
    if ((local_90 < 1.0) && (1.0 < local_98)) {
      local_130 = (double)(**(code **)(*in_RDI + 0xf8))(0x3ff0000000000000);
      if ((local_130 <= local_10) || (local_20 <= local_130)) {
        uVar2 = __cxa_allocate_exception(0x18);
        fmt::BasicCStringRef<char>::BasicCStringRef
                  (&local_138,"PLApprox maxErrRel(): preim(1.0) outside");
        Error::Error(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,c);
        __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
      }
      local_148 = 0x3ff0000000000000;
      local_140 = (local_130 - local_10) * local_c0 + local_18;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
                (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    }
    if ((local_90 < -1.0) && (-1.0 < local_98)) {
      local_150 = (double)(**(code **)(*in_RDI + 0xf8))(0xbff0000000000000);
      if ((local_150 <= local_10) || (local_20 <= local_150)) {
        uVar2 = __cxa_allocate_exception(0x18);
        fmt::BasicCStringRef<char>::BasicCStringRef
                  (&local_158,"PLApprox maxErrRel(): preim(-1.0) outside");
        Error::Error(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,c);
        __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
      }
      local_170[1] = -1.0;
      local_170[2] = (local_150 - local_10) * local_c0 + local_18;
      std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::push_back
                (in_stack_fffffffffffffda0,(value_type *)in_stack_fffffffffffffd98);
    }
    local_170[0] = 0.0;
    local_178 = local_88;
    local_180._M_current =
         (array<double,_2UL> *)
         std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::begin
                   ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
                    in_stack_fffffffffffffd98);
    local_188 = (array<double,_2UL> *)
                std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::end
                          ((vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>
                            *)in_stack_fffffffffffffd98);
    while (bVar1 = __gnu_cxx::operator!=
                             ((__normal_iterator<std::array<double,_2UL>_*,_std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                               *)in_stack_fffffffffffffda0,
                              (__normal_iterator<std::array<double,_2UL>_*,_std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                               *)in_stack_fffffffffffffd98), bVar1) {
      local_190 = __gnu_cxx::
                  __normal_iterator<std::array<double,_2UL>_*,_std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
                  ::operator*(&local_180);
      pvVar3 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_fffffffffffffda0,
                          (size_type)in_stack_fffffffffffffd98);
      local_198 = *pvVar3;
      pvVar3 = std::array<double,_2UL>::operator[]
                         ((array<double,_2UL> *)in_stack_fffffffffffffda0,
                          (size_type)in_stack_fffffffffffffd98);
      local_1a0 = *pvVar3;
      if ((local_198 < -1.0) || (1.0 < local_198)) {
        in_stack_fffffffffffffdb0 =
             (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
             (ABS(local_198 - local_1a0) / ABS(local_198));
      }
      else {
        in_stack_fffffffffffffdb0 =
             (vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_> *)
             ABS(local_198 - local_1a0);
      }
      local_1a8 = in_stack_fffffffffffffdb0;
      pdVar4 = std::max<double>(local_170,(double *)&local_1a8);
      local_170[0] = *pdVar4;
      __gnu_cxx::
      __normal_iterator<std::array<double,_2UL>_*,_std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>_>
      ::operator++(&local_180);
    }
    std::vector<std::array<double,_2UL>,_std::allocator<std::array<double,_2UL>_>_>::~vector
              (in_stack_fffffffffffffdb0);
    return local_170[0];
  }
  uVar2 = __cxa_allocate_exception(0x18);
  fmt::BasicCStringRef<char>::BasicCStringRef(&local_70,"PLApprox maxErrRel(): ubErr<=0");
  Error::Error(in_stack_fffffffffffffde8,in_stack_fffffffffffffdf0,c);
  __cxa_throw(uVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

double BasicPLApproximator<FuncCon>::maxErrorRelAbove1(
    double x0, double y0, double x1, double y1) {
  MP_ASSERT_ALWAYS(x1>x0,
                   fmt::format(
                     "PLApprox maxErrRel(): degenerate segment,"
                     " x0>=x1: {}, {}", x0, x1));
  MP_ASSERT_ALWAYS(laPrm_.ubErr>0.0,
                   "PLApprox maxErrRel(): ubErr<=0");
  std::vector< std::array<double, 2> > points;
  auto f0 = eval(x0);
  auto f1 = eval(x1);
  points.push_back({f0, y0});
  points.push_back({f1, y1});
  auto slope = (y1-y0)/(x1-x0);        // segment slope
  auto xMid = inverse_1st_with_check( slope );    // middle-value point
  points.push_back( { eval(xMid), y0 + (xMid-x0) * slope } );
  /// Assuming f' is monotone on the subinterval,
  /// check points of tilted slope assuming they are present.
  /// An alternative to evaluating f' on the endpoints
  /// would be to have a domain/subintervals for f'.
  auto fp0 = eval_1st(x0);
  auto fp1 = eval_1st(x1);
  if (fp0>fp1)
    std::swap(fp0, fp1);
  {
    auto slopeTiltedAway = slope / (1+laPrm_.ubErr);
    if (slopeTiltedAway>=fp0 && slopeTiltedAway<=fp1) {
      auto xMidUp = inverse_1st_with_check( slopeTiltedAway );
      points.push_back( { eval(xMidUp), y0 + (xMidUp-x0) * slope } );
    }
  }
  if (1.0!=laPrm_.ubErr) {
    auto slopeTiltedTo = slope / (1-laPrm_.ubErr);
    if (slopeTiltedTo>=fp0 && slopeTiltedTo<=fp1) {
      auto xMidDn = inverse_1st_with_check( slopeTiltedTo );
      points.push_back( { eval(xMidDn), y0 + (xMidDn-x0) * slope } );
    }
  }
  if (f0<1.0 && f1>1.0) {
    auto x_preim_1 = inverse_with_check(1.0);
    MP_ASSERT_ALWAYS(x0<x_preim_1 && x1>x_preim_1,
                     "PLApprox maxErrRel(): preim(1.0) outside");
    points.push_back( { 1.0, y0 + (x_preim_1-x0) * slope } );
  }
  if (f0<-1.0 && f1>-1.0) {
    auto x_preim_1 = inverse_with_check(-1.0);
    MP_ASSERT_ALWAYS(x0<x_preim_1 && x1>x_preim_1,
                     "PLApprox maxErrRel(): preim(-1.0) outside");
    points.push_back( { -1.0, y0 + (x_preim_1-x0) * slope } );
  }
  /// Check rel / abs errors in these points
  double errMax=0.0;
  for (const auto& pt: points) {
    auto f=pt[0];
    auto y=pt[1];
    auto err = (f>=-1.0 && f<=1.0) ?
          std::fabs(f-y) :                    // abs error in -1..1
          std::fabs(f-y) / std::fabs(f);      // rel error otherwise
    errMax = std::max(errMax, err);
  }
  return errMax;
}